

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::StddevState,double,duckdb::STDDevSampOperation>
               (double *idata,AggregateInputData *aggr_input_data,StddevState *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  bool bVar1;
  StddevState *in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  double *in_stack_ffffffffffffffa8;
  StddevState *pSVar2;
  StddevState *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = STDDevBaseOperation::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (pSVar2 = (StddevState *)0x0; pSVar2 < in_RCX;
        pSVar2 = (StddevState *)((long)&pSVar2->count + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pSVar2);
      STDDevBaseOperation::Operation<double,duckdb::StddevState,duckdb::STDDevSampOperation>
                (in_stack_ffffffffffffffb0,(double *)pSVar2,(AggregateUnaryInput *)0x814b4a);
    }
  }
  else {
    for (pSVar2 = (StddevState *)0x0; pSVar2 < in_RCX;
        pSVar2 = (StddevState *)((long)&pSVar2->count + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pSVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffffb8,(idx_t)pSVar2);
      if (bVar1) {
        STDDevBaseOperation::Operation<double,duckdb::StddevState,duckdb::STDDevSampOperation>
                  (pSVar2,in_stack_ffffffffffffffa8,(AggregateUnaryInput *)0x814af0);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}